

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O2

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOverwritesExisting<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>
::~AssignmentOverwritesExisting
          (AssignmentOverwritesExisting<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam n({gen()});
  n = m;
  EXPECT_EQ(m, n);
}